

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void Curl_infof(Curl_easy *data,char *fmt,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8f8 [16];
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  char local_848 [8];
  char print_buffer [2049];
  size_t len;
  va_list ap;
  char *fmt_local;
  Curl_easy *data_local;
  
  if (in_AL != '\0') {
    local_8c8 = in_XMM0_Qa;
    local_8b8 = in_XMM1_Qa;
    local_8a8 = in_XMM2_Qa;
    local_898 = in_XMM3_Qa;
    local_888 = in_XMM4_Qa;
    local_878 = in_XMM5_Qa;
    local_868 = in_XMM6_Qa;
    local_858 = in_XMM7_Qa;
  }
  if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x878 >> 0x1e & 1) != 0)) {
    ap[0].overflow_arg_area = local_8f8;
    ap[0]._0_8_ = &stack0x00000008;
    len._4_4_ = 0x30;
    len._0_4_ = 0x10;
    local_8e8 = in_RDX;
    local_8e0 = in_RCX;
    local_8d8 = in_R8;
    local_8d0 = in_R9;
    iVar1 = curl_mvsnprintf(local_848,0x801,fmt,(__va_list_tag *)&len);
    register0x00000000 = (size_t)iVar1;
    if (0x800 < register0x00000000) {
      sVar2 = strlen(fmt);
      register0x00000010 = sVar2 - 1;
      if (fmt[sVar2 - 1] == '\n') {
        curl_msnprintf(print_buffer + 0x7f4,5,"...\n");
      }
      else {
        curl_msnprintf(print_buffer + 0x7f5,4,"...");
      }
    }
    register0x00000000 = strlen(local_848);
    Curl_debug(data,CURLINFO_TEXT,local_848,register0x00000000);
  }
  return;
}

Assistant:

void Curl_infof(struct Curl_easy *data, const char *fmt, ...)
{
  if(data && data->set.verbose) {
    va_list ap;
    size_t len;
    char print_buffer[2048 + 1];
    va_start(ap, fmt);
    len = mvsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    /*
     * Indicate truncation of the input by replacing the last 3 characters
     * with "...", and transfer the newline over in case the format had one.
     */
    if(len >= sizeof(print_buffer)) {
      len = strlen(fmt);
      if(fmt[--len] == '\n')
        msnprintf(print_buffer + (sizeof(print_buffer) - 5), 5, "...\n");
      else
        msnprintf(print_buffer + (sizeof(print_buffer) - 4), 4, "...");
    }
    va_end(ap);
    len = strlen(print_buffer);
    Curl_debug(data, CURLINFO_TEXT, print_buffer, len);
  }
}